

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double rayleigh_cdf(double x,double a)

{
  undefined8 local_20;
  double cdf;
  double a_local;
  double x_local;
  
  if (0.0 <= x) {
    local_20 = exp((-x * x) / (a * 2.0 * a));
    local_20 = 1.0 - local_20;
  }
  else {
    local_20 = 0.0;
  }
  return local_20;
}

Assistant:

double rayleigh_cdf ( double x, double a )

//****************************************************************************80
//
//  Purpose:
//
//    RAYLEIGH_CDF evaluates the Rayleigh CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    17 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the CDF.
//    0.0 <= X.
//
//    Input, double A, the parameter of the PDF.
//    0.0 < A.
//
//    Output, double RAYLEIGH_CDF, the value of the CDF.
//
{
  double cdf;

  if ( x < 0.0 )
  {
    cdf = 0.0;
  }
  else
  {
    cdf = 1.0 - exp ( - x * x / ( 2.0 * a * a ) );
  }

  return cdf;
}